

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.cpp
# Opt level: O2

void crnlib::math::compute_lower_pow2_dim(int *width,int *height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = *height;
  iVar2 = 1;
  do {
    iVar3 = iVar2;
    iVar2 = iVar3 * 2;
  } while (iVar2 <= *width);
  *width = iVar3;
  iVar2 = 1;
  do {
    iVar3 = iVar2;
    iVar2 = iVar3 * 2;
  } while (iVar2 <= iVar1);
  *height = iVar3;
  return;
}

Assistant:

void compute_lower_pow2_dim(int& width, int& height) {
  const int tex_width = width;
  const int tex_height = height;

  width = 1;
  for (;;) {
    if ((width * 2) > tex_width)
      break;
    width *= 2;
  }

  height = 1;
  for (;;) {
    if ((height * 2) > tex_height)
      break;
    height *= 2;
  }
}